

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_LSR_zpzi(DisasContext_conflict1 *s,arg_rpri_esz *a)

{
  int esz;
  
  esz = a->esz;
  if (-1 < (long)esz) {
    if (a->imm < 8 << ((byte)esz & 0x1f)) {
      do_zpzi_ool(s,a,trans_LSR_zpzi::fns[esz]);
    }
    else {
      do_clr_zp(s,a->rd,a->pg,esz);
    }
  }
  return -1 < esz;
}

Assistant:

static bool trans_LSR_zpzi(DisasContext *s, arg_rpri_esz *a)
{
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_lsr_zpzi_b, gen_helper_sve_lsr_zpzi_h,
        gen_helper_sve_lsr_zpzi_s, gen_helper_sve_lsr_zpzi_d,
    };
    if (a->esz < 0) {
        return false;
    }
    /* Shift by element size is architecturally valid.
       For logical shifts, it is a zeroing operation.  */
    if (a->imm >= (8 << a->esz)) {
        return do_clr_zp(s, a->rd, a->pg, a->esz);
    } else {
        return do_zpzi_ool(s, a, fns[a->esz]);
    }
}